

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::TrendGroup> * metaf::TrendGroup::fromTimeSpan(string *s)

{
  bool bVar1;
  int iVar2;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_RDI;
  TrendGroup result;
  optional<metaf::MetafTime> till;
  optional<metaf::MetafTime> from;
  smatch match;
  TrendGroup *in_stack_fffffffffffffee8;
  TrendGroup *this;
  undefined4 in_stack_fffffffffffffef8;
  match_flag_type in_stack_fffffffffffffefc;
  undefined4 uVar3;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *__m;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  flag_type in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff30;
  string local_a8 [56];
  string local_70 [52];
  undefined4 local_3c;
  
  __m = in_RDI;
  if ((fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_),
     iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff24);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_);
  }
  this = (TrendGroup *)&stack0xffffffffffffffc8;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)this);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)__m,in_RDI,in_stack_fffffffffffffefc);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffefc);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)CONCAT44(uVar3,in_stack_fffffffffffffef8),(size_type)this);
    MetafTime::fromStringDDHH
              ((string *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::__cxx11::string::~string(local_70);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)CONCAT44(uVar3,in_stack_fffffffffffffef8),(size_type)this);
    MetafTime::fromStringDDHH
              ((string *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::__cxx11::string::~string(local_a8);
    bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x23f3f8);
    if ((bVar1) &&
       (bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x23f40b),
       bVar1)) {
      TrendGroup(this);
      std::optional<metaf::TrendGroup>::optional<metaf::TrendGroup,_true>
                ((optional<metaf::TrendGroup> *)this,in_stack_fffffffffffffee8);
    }
    else {
      memcpy(in_RDI,&fromTimeSpan::notRecognised,0x4c);
    }
  }
  else {
    memcpy(in_RDI,&fromTimeSpan::notRecognised,0x4c);
  }
  local_3c = 1;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x23f506);
  return (optional<metaf::TrendGroup> *)__m;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromTimeSpan(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("(\\d\\d\\d\\d)/(\\d\\d\\d\\d)");
	static const auto matchFrom = 1, matchTill = 2;
	std::smatch match;
	if (!regex_match(s, match, rgx)) return notRecognised;
	const auto from = MetafTime::fromStringDDHH(match.str(matchFrom));
	const auto till = MetafTime::fromStringDDHH(match.str(matchTill));
	if (!from.has_value() || !till.has_value()) return notRecognised;

	TrendGroup result;
	result.t = Type::TIME_SPAN;
	result.isTafTimeSpanGroup = true;
	result.tFrom = from;
	result.tTill = till;
	return result;
}